

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O2

CSubNet * LookupSubNet(CSubNet *__return_storage_ptr__,string *subnet_str)

{
  long lVar1;
  bool bVar2;
  size_type __n;
  char *extraout_RDX;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  DNSLookupFn in_stack_fffffffffffffeb8;
  uint8_t netmask;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_118;
  direct_or_indirect local_f8;
  undefined4 local_e8;
  undefined8 local_e0;
  optional<CNetAddr> full_netmask;
  string netmask_str;
  optional<CNetAddr> addr;
  string str_addr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CSubNet::CSubNet(__return_storage_ptr__);
  bVar2 = CSubNet::IsValid(__return_storage_ptr__);
  if (bVar2) {
    __assert_fail("!subnet.IsValid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp"
                  ,0x2f6,"CSubNet LookupSubNet(const std::string &)");
  }
  str_00._M_str = extraout_RDX;
  str_00._M_len = (size_t)(subnet_str->_M_dataplus)._M_p;
  bVar2 = util::ContainsNoNUL((util *)subnet_str->_M_string_length,str_00);
  if (bVar2) {
    __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                    (subnet_str,'/',0xffffffffffffffff);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&str_addr,subnet_str,0,__n);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function(&local_118,&g_dns_lookup_abi_cxx11_);
    LookupHost(&addr,&str_addr,false,in_stack_fffffffffffffeb8);
    std::_Function_base::~_Function_base(&local_118.super__Function_base);
    if (addr.super__Optional_base<CNetAddr,_false,_false>._M_payload.
        super__Optional_payload<CNetAddr,_true,_false,_false>.super__Optional_payload_base<CNetAddr>
        ._M_engaged == true) {
      CService::CService((CService *)&full_netmask,(CNetAddr *)&addr,0);
      MaybeFlipIPv6toCJDNS((CService *)&local_f8.indirect_contents,(CService *)&full_netmask);
      netmask_str.field_2._M_allocated_capacity._0_4_ = local_e8;
      local_e8 = 0;
      netmask_str._M_dataplus._M_p = local_f8.indirect_contents.indirect;
      netmask_str._M_string_length = local_f8._8_8_;
      netmask_str.field_2._8_8_ = local_e0;
      std::optional<CNetAddr>::operator=(&addr,(CNetAddr *)&netmask_str);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&netmask_str);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8.indirect_contents);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&full_netmask);
      if (__n == 0xffffffffffffffff) {
        if (addr.super__Optional_base<CNetAddr,_false,_false>._M_payload.
            super__Optional_payload<CNetAddr,_true,_false,_false>.
            super__Optional_payload_base<CNetAddr>._M_engaged == false) {
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            std::__throw_bad_optional_access();
          }
          goto LAB_0059cbf2;
        }
        CSubNet::CSubNet((CSubNet *)&local_f8.indirect_contents,(CNetAddr *)&addr);
        CSubNet::operator=(__return_storage_ptr__,(CSubNet *)&local_f8.indirect_contents);
        prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8.indirect_contents);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&netmask_str,subnet_str,__n + 1,0xffffffffffffffff);
        str._M_str = netmask_str._M_dataplus._M_p;
        str._M_len = netmask_str._M_string_length;
        bVar2 = ParseUInt8(str,&netmask);
        if (bVar2) {
          if (addr.super__Optional_base<CNetAddr,_false,_false>._M_payload.
              super__Optional_payload<CNetAddr,_true,_false,_false>.
              super__Optional_payload_base<CNetAddr>._M_engaged == false) {
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              std::__throw_bad_optional_access();
            }
            goto LAB_0059cbf2;
          }
          CSubNet::CSubNet((CSubNet *)&local_f8.indirect_contents,(CNetAddr *)&addr,netmask);
          CSubNet::operator=(__return_storage_ptr__,(CSubNet *)&local_f8.indirect_contents);
          prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                    ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8.indirect_contents
                    );
        }
        else {
          std::
          function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
          ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                      *)&stack0xfffffffffffffec0,&g_dns_lookup_abi_cxx11_);
          LookupHost(&full_netmask,&netmask_str,false,in_stack_fffffffffffffeb8);
          std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffec0);
          if (full_netmask.super__Optional_base<CNetAddr,_false,_false>._M_payload.
              super__Optional_payload<CNetAddr,_true,_false,_false>.
              super__Optional_payload_base<CNetAddr>._M_engaged == true) {
            if (addr.super__Optional_base<CNetAddr,_false,_false>._M_payload.
                super__Optional_payload<CNetAddr,_true,_false,_false>.
                super__Optional_payload_base<CNetAddr>._M_engaged == false) {
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                std::__throw_bad_optional_access();
              }
              goto LAB_0059cbf2;
            }
            CSubNet::CSubNet((CSubNet *)&local_f8.indirect_contents,(CNetAddr *)&addr,
                             (CNetAddr *)&full_netmask);
            CSubNet::operator=(__return_storage_ptr__,(CSubNet *)&local_f8.indirect_contents);
            prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                       &local_f8.indirect_contents);
          }
          std::_Optional_payload_base<CNetAddr>::_M_reset
                    ((_Optional_payload_base<CNetAddr> *)&full_netmask);
        }
        std::__cxx11::string::~string((string *)&netmask_str);
      }
    }
    std::_Optional_payload_base<CNetAddr>::_M_reset((_Optional_payload_base<CNetAddr> *)&addr);
    std::__cxx11::string::~string((string *)&str_addr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
LAB_0059cbf2:
  __stack_chk_fail();
}

Assistant:

CSubNet LookupSubNet(const std::string& subnet_str)
{
    CSubNet subnet;
    assert(!subnet.IsValid());
    if (!ContainsNoNUL(subnet_str)) {
        return subnet;
    }

    const size_t slash_pos{subnet_str.find_last_of('/')};
    const std::string str_addr{subnet_str.substr(0, slash_pos)};
    std::optional<CNetAddr> addr{LookupHost(str_addr, /*fAllowLookup=*/false)};

    if (addr.has_value()) {
        addr = static_cast<CNetAddr>(MaybeFlipIPv6toCJDNS(CService{addr.value(), /*port=*/0}));
        if (slash_pos != subnet_str.npos) {
            const std::string netmask_str{subnet_str.substr(slash_pos + 1)};
            uint8_t netmask;
            if (ParseUInt8(netmask_str, &netmask)) {
                // Valid number; assume CIDR variable-length subnet masking.
                subnet = CSubNet{addr.value(), netmask};
            } else {
                // Invalid number; try full netmask syntax. Never allow lookup for netmask.
                const std::optional<CNetAddr> full_netmask{LookupHost(netmask_str, /*fAllowLookup=*/false)};
                if (full_netmask.has_value()) {
                    subnet = CSubNet{addr.value(), full_netmask.value()};
                }
            }
        } else {
            // Single IP subnet (<ipv4>/32 or <ipv6>/128).
            subnet = CSubNet{addr.value()};
        }
    }

    return subnet;
}